

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

char mbedtls_ct_base64_dec_value(uchar c)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 uVar5;
  ushort uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [15];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined7 in_register_00000039;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar24;
  uint uVar23;
  uint uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar19 = (uint)CONCAT71(in_register_00000039,c);
  uVar5 = (undefined1)((uint7)in_register_00000039 >> 8);
  uVar24 = (undefined1)((uint7)in_register_00000039 >> 0x10);
  auVar20._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar24,uVar24),uVar5),CONCAT14(uVar5,uVar19)) >> 0x20);
  auVar20[3] = (char)in_register_00000039;
  auVar20[2] = (char)in_register_00000039;
  auVar20[1] = c;
  auVar20[0] = c;
  auVar20._8_8_ = 0;
  auVar20 = pshuflw(auVar20,auVar20,0);
  uVar18 = (uint)mbedtls_ct_zero;
  uVar17 = (uVar18 ^ uVar19) & 0xff;
  auVar27._4_4_ = uVar18;
  auVar27._0_4_ = uVar18;
  auVar27._12_4_ = uVar18;
  auVar27._8_4_ = uVar18;
  auVar16._6_8_ = 0;
  auVar16._0_6_ = auVar20._7_6_;
  auVar1[0xe] = auVar20[7];
  auVar1._0_14_ = auVar16 << 0x38;
  auVar3._13_2_ = auVar1._13_2_;
  auVar3[0xc] = auVar20[6];
  auVar15._4_8_ = 0;
  auVar15._0_4_ = auVar20._7_4_;
  auVar3._0_12_ = auVar15 << 0x38;
  auVar4._11_4_ = auVar3._11_4_;
  auVar4[10] = auVar20[5];
  auVar4._0_10_ = (unkuint10)auVar20._7_2_ << 0x38;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = (uint7)(CONCAT62(auVar4._9_6_,CONCAT11(auVar20[4],auVar20[7])) >> 8);
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),auVar20[3] + '\x11');
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar10[0] = auVar20[2] + '\x14';
  auVar11._11_4_ = 0;
  auVar11._0_11_ = auVar10;
  auVar12._1_12_ = SUB1512(auVar11 << 0x20,3);
  auVar12[0] = auVar20[1] + '\x05';
  uVar6 = CONCAT11(0,auVar20[0] - 0x40);
  auVar7._2_13_ = auVar12;
  auVar7._0_2_ = uVar6;
  auVar2._10_2_ = 0;
  auVar2._0_10_ = auVar7._0_10_;
  auVar2._12_2_ = (short)Var9;
  auVar13._2_4_ = auVar2._10_4_;
  auVar13._0_2_ = auVar10._0_2_;
  auVar13._6_8_ = 0;
  auVar21._6_8_ = SUB148(auVar13 << 0x40,6);
  auVar21._4_2_ = auVar12._0_2_;
  auVar21._2_2_ = 0;
  auVar21._0_2_ = uVar6;
  auVar21._14_2_ = 0;
  uVar23 = (uVar19 ^ uVar18) & 0xff;
  uVar25 = (uVar19 ^ uVar18) & 0xff;
  uVar26 = (uVar19 ^ uVar18) & 0xff;
  uVar18 = (uVar19 ^ uVar18) & 0xff;
  auVar28._0_4_ = (0x5a - uVar23 | uVar23 + 0xffbf) >> 8;
  auVar28._4_4_ = (0x39 - uVar25 | uVar25 + 0xffd0) >> 8;
  auVar28._8_4_ = (0x2b - uVar26 | uVar26 + 0xffd5) >> 8;
  auVar28._12_4_ = (0x2f - uVar18 | uVar18 + 0xffd1) >> 8;
  auVar20 = ~auVar28 & (auVar21 ^ auVar27);
  auVar22._0_8_ = auVar20._8_8_;
  auVar22._8_4_ = auVar20._8_4_;
  auVar22._12_4_ = auVar20._12_4_;
  return (SUB161(auVar22 | auVar20,4) | SUB161(auVar22 | auVar20,0) |
         ~((byte)(uVar17 + 0xff9f >> 8) | (byte)(0x7a - uVar17 >> 8)) &
         ((byte)mbedtls_ct_zero ^ c + 0xba)) - 1;
}

Assistant:

MBEDTLS_STATIC_TESTABLE
signed char mbedtls_ct_base64_dec_value(unsigned char c)
{
    unsigned char val = 0;
    /* For each range of digits, if c is in that range, mask val with
     * the corresponding value. Since c can only be in a single range,
     * only at most one masking will change val. Set val to one plus
     * the desired value so that it stays 0 if c is in none of the ranges. */
    val |= mbedtls_ct_uchar_in_range_if('A', 'Z', c, c - 'A' +  0 + 1);
    val |= mbedtls_ct_uchar_in_range_if('a', 'z', c, c - 'a' + 26 + 1);
    val |= mbedtls_ct_uchar_in_range_if('0', '9', c, c - '0' + 52 + 1);
    val |= mbedtls_ct_uchar_in_range_if('+', '+', c, c - '+' + 62 + 1);
    val |= mbedtls_ct_uchar_in_range_if('/', '/', c, c - '/' + 63 + 1);
    /* At this point, val is 0 if c is an invalid digit and v+1 if c is
     * a digit with the value v. */
    return val - 1;
}